

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_as_json_double(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *unaff_R14;
  char *unaff_R15;
  size_t len;
  undefined1 local_20 [8];
  
  uVar3 = bson_new();
  cVar1 = bson_append_double(0x405ee00000000000,uVar3,"foo",0xffffffff);
  if (cVar1 == '\0') {
    test_bson_as_json_double_cold_1();
LAB_0012d1b2:
    test_bson_as_json_double_cold_2();
LAB_0012d1b7:
    test_bson_as_json_double_cold_3();
LAB_0012d1bc:
    test_bson_as_json_double_cold_4();
  }
  else {
    cVar1 = bson_append_double(0x4008000000000000,uVar3,"bar",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d1b2;
    cVar1 = bson_append_double(0xbff0000000000000,uVar3,"baz",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d1b7;
    cVar1 = bson_append_double(0x3fa0000000000000,uVar3,"quux",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d1bc;
    cVar1 = bson_append_double(0x547d42aea2879f2e,uVar3,"huge",0xffffffff);
    if (cVar1 != '\0') {
      unaff_R14 = (char *)bson_as_json(uVar3,local_20);
      unaff_R15 = (char *)bson_strdup_printf(0x547d42aea2879f2e,
                                             "{ \"foo\" : 123.5, \"bar\" : 3.0, \"baz\" : -1.0, \"quux\" : 0.03125, \"huge\" : %.20g }"
                                            );
      if (unaff_R14 == unaff_R15) {
LAB_0012d18b:
        bson_free(unaff_R15);
        bson_free(unaff_R14);
        bson_destroy(uVar3);
        return;
      }
      iVar2 = strcmp(unaff_R14,unaff_R15);
      if (iVar2 == 0) goto LAB_0012d18b;
      goto LAB_0012d1c6;
    }
  }
  test_bson_as_json_double_cold_5();
LAB_0012d1c6:
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",unaff_R14,unaff_R15);
  abort();
}

Assistant:

static void
test_bson_as_json_double (void)
{
   size_t len;
   bson_t *b;
   char *str;
   char *expected;

   b = bson_new ();
   BSON_ASSERT (bson_append_double (b, "foo", -1, 123.5));
   BSON_ASSERT (bson_append_double (b, "bar", -1, 3));
   BSON_ASSERT (bson_append_double (b, "baz", -1, -1));
   BSON_ASSERT (bson_append_double (b, "quux", -1, 0.03125));
   BSON_ASSERT (bson_append_double (b, "huge", -1, 1e99));
   str = bson_as_json (b, &len);

   expected = bson_strdup_printf ("{"
                                  " \"foo\" : 123.5,"
                                  " \"bar\" : 3.0,"
                                  " \"baz\" : -1.0,"
                                  " \"quux\" : 0.03125,"
                                  " \"huge\" : %.20g }",
                                  1e99);

   ASSERT_CMPSTR (str, expected);

   bson_free (expected);
   bson_free (str);
   bson_destroy (b);
}